

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doc_comment.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::WriteEnumValueDocComment
          (java *this,Printer *printer,EnumValueDescriptor *value,Options *options)

{
  undefined2 uVar1;
  undefined4 uVar2;
  undefined1 *puVar3;
  bool bVar4;
  string_view text;
  string_view text_00;
  string_view input;
  SourceLocation location;
  long *local_150;
  long local_148;
  long local_140 [2];
  long *local_130;
  long local_128;
  long local_120 [3];
  undefined1 local_108 [8];
  _Alloc_hider local_100;
  undefined1 local_f8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  _Alloc_hider local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  bool local_c0;
  bool bStack_bf;
  string local_b8;
  undefined1 local_98 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  text._M_str = "/**\n";
  text._M_len = 4;
  io::Printer::Print<>((Printer *)this,text);
  uVar1 = *(undefined2 *)&value->number_;
  uVar2._0_1_ = *(bool *)&value->super_SymbolBaseN<0>;
  uVar2._1_1_ = *(bool *)&value->super_SymbolBaseN<1>;
  uVar2._2_1_ = (bool)value->field_0x2;
  uVar2._3_1_ = (bool)value->field_0x3;
  local_150 = local_140;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,value->all_names_,
             &value->type_->super_SymbolBase + (long)&(value->all_names_->_M_dataplus)._M_p);
  local_130 = local_120;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,value->merged_features_,
             (long)&(value->merged_features_->super_Message).super_MessageLite._vptr_MessageLite +
             *(long *)(value + 1));
  local_120[2]._0_2_ = *(undefined2 *)&value[1].options_;
  local_98._24_8_ = 0;
  local_78._M_local_buf[0] = '\0';
  local_60 = 0;
  local_58._M_local_buf[0] = '\0';
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._16_8_ = &local_78;
  local_68._M_p = (pointer)&local_58;
  bVar4 = EnumValueDescriptor::GetSourceLocation
                    ((EnumValueDescriptor *)printer,(SourceLocation *)local_98);
  if (bVar4) {
    local_108._0_4_ = uVar2;
    local_108._4_2_ = uVar1;
    local_100._M_p = (pointer)(local_f8 + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_100,local_150,local_148 + (long)local_150);
    local_e0._M_p = (pointer)&local_d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e0,local_130,local_128 + (long)local_130);
    local_c0 = local_120[2]._0_1_;
    bStack_bf = local_120[2]._1_1_;
    options = (Options *)0x0;
    WriteDocCommentBodyForLocation
              ((Printer *)this,(SourceLocation *)local_98,(Options *)local_108,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_p != &local_d0) {
      operator_delete(local_e0._M_p,local_d0._M_allocated_capacity + 1);
    }
    if ((java *)local_100._M_p != (java *)(local_f8 + 8)) {
      operator_delete(local_100._M_p,local_f0._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_p != &local_58) {
    operator_delete(local_68._M_p,
                    CONCAT71(local_58._M_allocated_capacity._1_7_,local_58._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._16_8_ != &local_78) {
    operator_delete((void *)local_98._16_8_,
                    CONCAT71(local_78._M_allocated_capacity._1_7_,local_78._M_local_buf[0]) + 1);
  }
  if (local_130 != local_120) {
    operator_delete(local_130,local_120[0] + 1);
  }
  if (local_150 != local_140) {
    operator_delete(local_150,local_140[0] + 1);
  }
  EnumValueDescriptor::DebugString_abi_cxx11_(&local_b8,(EnumValueDescriptor *)printer);
  FirstLineOf((string *)local_108,&local_b8);
  input._M_len._4_2_ = local_108._4_2_;
  input._M_len._0_4_ = local_108._0_4_;
  input._M_len._6_2_ = local_108._6_2_;
  input._M_str = &options->generate_immutable_code;
  EscapeJavadoc_abi_cxx11_((string *)local_98,(java *)local_100._M_p,input);
  text_00._M_str = " * <code>$def$</code>\n */\n";
  text_00._M_len = 0x1a;
  io::Printer::Print<char[4],std::__cxx11::string>
            ((Printer *)this,text_00,(char (*) [4])0x582017,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
  if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
    operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
  }
  puVar3 = (undefined1 *)CONCAT26(local_108._6_2_,CONCAT24(local_108._4_2_,local_108._0_4_));
  if (puVar3 != local_f8) {
    operator_delete(puVar3,(long)local_f8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void WriteEnumValueDocComment(io::Printer* printer,
                              const EnumValueDescriptor* value,
                              const Options options) {
  printer->Print("/**\n");
  WriteDocCommentBody(printer, value, options, /* kdoc */ false);

  printer->Print(
      " * <code>$def$</code>\n"
      " */\n",
      "def", EscapeJavadoc(FirstLineOf(value->DebugString())));
}